

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  node *pnVar1;
  undefined1 auStack_13990 [8];
  nodecontext Context;
  int i;
  node *p [10000];
  char **argv_local;
  int argc_local;
  
  NodeContext_Init((nodecontext *)auStack_13990,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0)
  ;
  for (Context._236_4_ = 0; (int)Context._236_4_ < 10000; Context._236_4_ = Context._236_4_ + 1) {
    pnVar1 = NodeCreate(auStack_13990,0x45444f4e);
    *(node **)(&stack0xfffffffffffec768 + (long)(int)Context._236_4_ * 8) = pnVar1;
  }
  for (Context._236_4_ = 0; (int)Context._236_4_ < 1000000; Context._236_4_ = Context._236_4_ + 1) {
    pnVar1 = NodeCreate(auStack_13990,0x45444f4e);
    NodeDelete(pnVar1);
  }
  for (Context._236_4_ = 0; (int)Context._236_4_ < 10000; Context._236_4_ = Context._236_4_ + 1) {
    NodeDelete(*(node **)(&stack0xfffffffffffec768 + (long)(int)Context._236_4_ * 8));
  }
  NodeContext_Done((nodecontext *)auStack_13990);
  return 0;
}

Assistant:

int main(int UNUSED_PARAM(argc),char** UNUSED_PARAM(argv))
{
    node* p[10000];
    int i;
    nodecontext Context;
    NodeContext_Init(&Context,NULL,NULL,NULL);

    for (i=0;i<10000;++i)
        p[i] = NodeCreate(&Context,NODE_CLASS);

    for (i=0;i<1000000;++i)
        NodeDelete(NodeCreate(&Context,NODE_CLASS));

    for (i=0;i<10000;++i)
        NodeDelete(p[i]);

    NodeContext_Done(&Context);
    return 0;
}